

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzblockdiag.cpp
# Opt level: O2

void __thiscall
TPZBlockDiagonal<std::complex<double>_>::TPZBlockDiagonal
          (TPZBlockDiagonal<std::complex<double>_> *this,TPZVec<int> *blocksizes,
          TPZFMatrix<std::complex<double>_> *glob)

{
  int iVar1;
  int *piVar2;
  long *plVar3;
  complex<double> *pcVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  int64_t newsize;
  long lVar9;
  ulong uVar10;
  ulong uVar11;
  long lVar12;
  long lVar13;
  bool bVar14;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Db;
  undefined8 in_XMM1_Qa;
  long local_98;
  complex<double> local_48;
  
  (this->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fRow = 0;
  (this->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fCol = 0;
  (this->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fDecomposed = '\0';
  (this->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fDefPositive = '\0';
  (this->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.super_TPZSavable.
  _vptr_TPZSavable = (_func_int **)&PTR__TPZBlockDiagonal_016672e0;
  (this->fStorage)._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0164ea78;
  (this->fStorage).fStore = (complex<double> *)0x0;
  (this->fStorage).fNElements = 0;
  (this->fStorage).fNAlloc = 0;
  (this->fBlockPos)._vptr_TPZVec = (_func_int **)&PTR__TPZVec_01649268;
  (this->fBlockPos).fStore = (long *)0x0;
  (this->fBlockPos).fNElements = 0;
  (this->fBlockPos).fNAlloc = 0;
  TPZVec<int>::TPZVec(&this->fBlockSize,blocksizes);
  lVar9 = blocksizes->fNElements;
  local_48._M_value._0_8_ = 0;
  TPZVec<long>::Resize(&this->fBlockPos,lVar9 + 1,(long *)&local_48);
  piVar2 = blocksizes->fStore;
  plVar3 = (this->fBlockPos).fStore;
  newsize = 0;
  if (lVar9 < 1) {
    lVar9 = newsize;
  }
  lVar7 = 0;
  for (lVar6 = 0; lVar9 != lVar6; lVar6 = lVar6 + 1) {
    iVar1 = piVar2[lVar6];
    lVar7 = lVar7 + iVar1;
    newsize = newsize + (ulong)(uint)(iVar1 * iVar1);
    plVar3[lVar6 + 1] = (ulong)(uint)(iVar1 * iVar1) + plVar3[lVar6];
  }
  local_48._M_value._0_8_ = 0;
  local_48._M_value._8_8_ = 0;
  TPZVec<std::complex<double>_>::Resize(&this->fStorage,newsize,&local_48);
  (this->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fRow = lVar7;
  (this->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.fCol = lVar7;
  local_98 = 0;
  for (lVar6 = 0; lVar6 != lVar9; lVar6 = lVar6 + 1) {
    lVar13 = (long)(this->fBlockSize).fStore[lVar6];
    lVar7 = 0;
    if (0 < lVar13) {
      lVar7 = lVar13;
    }
    uVar10 = (this->fBlockPos).fStore[lVar6] << 4 | 8;
    for (lVar5 = 0; lVar5 != lVar7; lVar5 = lVar5 + 1) {
      lVar8 = local_98;
      uVar11 = uVar10;
      lVar12 = lVar13;
      while (bVar14 = lVar12 != 0, lVar12 = lVar12 + -1, bVar14) {
        (*(glob->super_TPZMatrix<std::complex<double>_>).super_TPZBaseMatrix.super_TPZSavable.
          _vptr_TPZSavable[0x24])(glob,lVar5 + local_98,lVar8);
        pcVar4 = (this->fStorage).fStore;
        *(ulong *)(pcVar4->_M_value + (uVar11 - 8)) = CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da);
        *(undefined8 *)(pcVar4->_M_value + uVar11) = in_XMM1_Qa;
        lVar8 = lVar8 + 1;
        uVar11 = uVar11 + lVar13 * 0x10;
      }
      uVar10 = uVar10 + 0x10;
    }
    local_98 = local_98 + lVar13;
  }
  return;
}

Assistant:

TPZBlockDiagonal<TVar>::TPZBlockDiagonal(const TPZVec<int> &blocksizes, const TPZFMatrix<TVar> &glob)
: TPZRegisterClassId(&TPZBlockDiagonal::ClassId),
TPZMatrix<TVar>(), fBlockSize(blocksizes)
{
	int64_t nblock = blocksizes.NElements();
	fBlockPos.Resize(nblock+1,0);
	int64_t b;
	int64_t ndata = 0;
	int64_t neq = 0;
	int bsize;
	for(b=0; b<nblock; b++) {
		bsize = blocksizes[b];
		fBlockPos[b+1] = fBlockPos[b]+bsize*bsize;
		ndata += bsize*bsize;
		neq += bsize;
	}
	fStorage.Resize(ndata,0.);
	this->fRow = neq;
	this->fCol = neq;
	int64_t pos;
	int64_t eq = 0, r, c;
	for(b=0; b<nblock; b++) {
		bsize = fBlockSize[b];
		pos = fBlockPos[b];
		for(r=0; r<bsize; r++) {
			for(c=0; c<bsize; c++) {
				fStorage[pos+r+bsize*c]= glob.GetVal(eq+r,eq+c);
			}
		}
		eq += bsize;
	}
	
}